

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

CURLcode Curl_http_done(connectdata *conn,CURLcode status,_Bool premature)

{
  Curl_easy *data_00;
  FormData **form_ptr;
  HTTP *http;
  Curl_easy *data;
  _Bool premature_local;
  CURLcode status_local;
  connectdata *conn_local;
  
  data_00 = conn->data;
  form_ptr = (FormData **)(data_00->req).protop;
  Curl_unencode_cleanup(conn);
  conn->seek_func = (data_00->set).seek_func;
  conn->seek_client = (data_00->set).seek_client;
  if (form_ptr == (FormData **)0x0) {
    conn_local._4_4_ = CURLE_OK;
  }
  else {
    if (form_ptr[0x10] != (FormData *)0x0) {
      Curl_add_buffer_free((Curl_send_buffer *)form_ptr[0x10]);
      form_ptr[0x10] = (FormData *)0x0;
    }
    if ((data_00->set).httpreq == HTTPREQ_POST_FORM) {
      (data_00->req).bytecount = (long)&form_ptr[6]->next + (long)&form_ptr[5]->next;
      Curl_formclean(form_ptr);
      if (form_ptr[9] != (FormData *)0x0) {
        fclose((FILE *)form_ptr[9]);
        form_ptr[9] = (FormData *)0x0;
      }
    }
    else if ((data_00->set).httpreq == HTTPREQ_PUT) {
      (data_00->req).bytecount = (long)&form_ptr[6]->next + (long)&form_ptr[5]->next;
    }
    conn_local._4_4_ = status;
    if (status == CURLE_OK) {
      if ((((premature) || (((conn->bits).retry & 1U) != 0)) ||
          (((data_00->set).connect_only & 1U) != 0)) ||
         (0 < (long)form_ptr[5] +
              ((data_00->req).headerbytecount - (data_00->req).deductheadercount))) {
        conn_local._4_4_ = CURLE_OK;
      }
      else {
        Curl_failf(data_00,"Empty reply from server");
        conn_local._4_4_ = CURLE_GOT_NOTHING;
      }
    }
  }
  return conn_local._4_4_;
}

Assistant:

CURLcode Curl_http_done(struct connectdata *conn,
                        CURLcode status, bool premature)
{
  struct Curl_easy *data = conn->data;
  struct HTTP *http = data->req.protop;
#ifdef USE_NGHTTP2
  struct http_conn *httpc = &conn->proto.httpc;
#endif

  Curl_unencode_cleanup(conn);

#ifdef USE_SPNEGO
  if(data->state.proxyneg.state == GSS_AUTHSENT ||
     data->state.negotiate.state == GSS_AUTHSENT) {
    /* add forbid re-use if http-code != 401/407 as a WA only needed for
     * 401/407 that signal auth failure (empty) otherwise state will be RECV
     * with current code.
     * Do not close CONNECT_ONLY connections. */
    if((data->req.httpcode != 401) && (data->req.httpcode != 407) &&
       !data->set.connect_only)
      connclose(conn, "Negotiate transfer completed");
    Curl_cleanup_negotiate(data);
  }
#endif

  /* set the proper values (possibly modified on POST) */
  conn->seek_func = data->set.seek_func; /* restore */
  conn->seek_client = data->set.seek_client; /* restore */

  if(!http)
    return CURLE_OK;

  if(http->send_buffer) {
    Curl_add_buffer_free(http->send_buffer);
    http->send_buffer = NULL; /* clear the pointer */
  }

#ifdef USE_NGHTTP2
  if(http->header_recvbuf) {
    DEBUGF(infof(data, "free header_recvbuf!!\n"));
    Curl_add_buffer_free(http->header_recvbuf);
    http->header_recvbuf = NULL; /* clear the pointer */
    Curl_add_buffer_free(http->trailer_recvbuf);
    http->trailer_recvbuf = NULL; /* clear the pointer */
    if(http->push_headers) {
      /* if they weren't used and then freed before */
      for(; http->push_headers_used > 0; --http->push_headers_used) {
        free(http->push_headers[http->push_headers_used - 1]);
      }
      free(http->push_headers);
      http->push_headers = NULL;
    }
  }
  if(http->stream_id) {
    nghttp2_session_set_stream_user_data(httpc->h2, http->stream_id, 0);
    http->stream_id = 0;
  }
#endif

  if(HTTPREQ_POST_FORM == data->set.httpreq) {
    data->req.bytecount = http->readbytecount + http->writebytecount;

    Curl_formclean(&http->sendit); /* Now free that whole lot */
    if(http->form.fp) {
      /* a file being uploaded was left opened, close it! */
      fclose(http->form.fp);
      http->form.fp = NULL;
    }
  }
  else if(HTTPREQ_PUT == data->set.httpreq)
    data->req.bytecount = http->readbytecount + http->writebytecount;

  if(status)
    return status;

  if(!premature && /* this check is pointless when DONE is called before the
                      entire operation is complete */
     !conn->bits.retry &&
     !data->set.connect_only &&
     (http->readbytecount +
      data->req.headerbytecount -
      data->req.deductheadercount) <= 0) {
    /* If this connection isn't simply closed to be retried, AND nothing was
       read from the HTTP server (that counts), this can't be right so we
       return an error here */
    failf(data, "Empty reply from server");
    return CURLE_GOT_NOTHING;
  }

  return CURLE_OK;
}